

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageLoadAndStoreCase::ImageLoadAndStoreCase
          (ImageLoadAndStoreCase *this,Context *context,char *name,char *description,
          TextureFormat *format,TextureType textureType,deUint32 caseFlags)

{
  TextureType textureType_local;
  TextureFormat *format_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ImageLoadAndStoreCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageLoadAndStoreCase_032c1700;
  this->m_textureFormat = *format;
  this->m_imageFormat = *format;
  this->m_textureType = textureType;
  this->m_restrictImages = (caseFlags & 2) != 0;
  this->m_singleLayerBind = (caseFlags & 1) != 0;
  return;
}

Assistant:

ImageLoadAndStoreCase (Context& context, const char* name, const char* description, const TextureFormat& format, TextureType textureType, deUint32 caseFlags = 0)
		: TestCase				(context, name, description)
		, m_textureFormat		(format)
		, m_imageFormat			(format)
		, m_textureType			(textureType)
		, m_restrictImages		((caseFlags & CASEFLAG_RESTRICT_IMAGES)		!= 0)
		, m_singleLayerBind		((caseFlags & CASEFLAG_SINGLE_LAYER_BIND)	!= 0)
	{
	}